

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<double>::ComputeEigenvectorsInternal(TPZTensor<double> *this,TPZDecomposed *eigensystem)

{
  TPZManVector<double,_3> *pTVar1;
  uint *puVar2;
  TPZVec<double> *in_RSI;
  TPZManVector<TPZManVector<double,_3>,_3> *eigenvec;
  TPZManVector<double,_3> *eigenval;
  TPZManVector<double,_3> *in_stack_00000310;
  double *in_stack_00000318;
  TPZTensor<double> *in_stack_00000320;
  TPZManVector<double,_3> *in_stack_00000568;
  double *in_stack_00000570;
  TPZManVector<double,_3> *in_stack_00000578;
  TPZTensor<double> *in_stack_00000580;
  TPZVec<TPZManVector<double,_3>_> *this_00;
  TPZVec<double> *this_01;
  
  this_01 = (TPZVec<double> *)&in_RSI[1].fNAlloc;
  this_00 = (TPZVec<TPZManVector<double,_3>_> *)&in_RSI[3].fNElements;
  (**(code **)(*(long *)this_00 + 0x20))(this_00,3);
  pTVar1 = TPZVec<TPZManVector<double,_3>_>::operator[](this_00,0);
  (*(pTVar1->super_TPZVec<double>)._vptr_TPZVec[4])(pTVar1,3);
  pTVar1 = TPZVec<TPZManVector<double,_3>_>::operator[](this_00,1);
  (*(pTVar1->super_TPZVec<double>)._vptr_TPZVec[4])(pTVar1,3);
  pTVar1 = TPZVec<TPZManVector<double,_3>_>::operator[](this_00,2);
  (*(pTVar1->super_TPZVec<double>)._vptr_TPZVec[4])(pTVar1,3);
  puVar2 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)&in_RSI->fStore,0);
  if (*puVar2 == 1) {
    TPZVec<double>::operator[](this_01,0);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_00,0);
    ComputeEigenvector0(in_stack_00000320,in_stack_00000318,in_stack_00000310);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_00,0);
    TPZVec<double>::operator[](this_01,1);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_00,1);
    ComputeEigenvector1(in_stack_00000580,in_stack_00000578,in_stack_00000570,in_stack_00000568);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_00,0);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_00,1);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_00,2);
    Cross<double>(in_RSI,this_01,(TPZVec<double> *)this_00);
  }
  else {
    TPZVec<double>::operator[](this_01,2);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_00,2);
    ComputeEigenvector0(in_stack_00000320,in_stack_00000318,in_stack_00000310);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_00,2);
    TPZVec<double>::operator[](this_01,1);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_00,1);
    ComputeEigenvector1(in_stack_00000580,in_stack_00000578,in_stack_00000570,in_stack_00000568);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_00,1);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_00,2);
    TPZVec<TPZManVector<double,_3>_>::operator[](this_00,0);
    Cross<double>(in_RSI,this_01,(TPZVec<double> *)this_00);
  }
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvectorsInternal(TPZDecomposed &eigensystem) const {
    TPZManVector<T, 3> &eigenval = eigensystem.fEigenvalues;
    TPZManVector<TPZManVector<T, 3>, 3> &eigenvec = eigensystem.fEigenvectors;

    eigenvec.resize(3);
    eigenvec[0].resize(3);
    eigenvec[1].resize(3);
    eigenvec[2].resize(3);
    // Compute the eigenvectors so that the set {evec[0], evec[1], evec[2]}
    // is right handed and orthonormal.
    if (eigensystem.fGeometricMultiplicity[0] == 1) {
        ComputeEigenvector0(eigenval[0], eigenvec[0]);
        ComputeEigenvector1(eigenvec[0], eigenval[1], eigenvec[1]);
        Cross(eigenvec[0], eigenvec[1], eigenvec[2]);
    } else {
        ComputeEigenvector0(eigenval[2], eigenvec[2]);
        ComputeEigenvector1(eigenvec[2], eigenval[1], eigenvec[1]);
        Cross(eigenvec[1], eigenvec[2], eigenvec[0]);
    }
}